

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

void __thiscall
flatbuffers::go::GoGenerator::GenEnum(GoGenerator *this,EnumDef *enum_def,string *code_ptr)

{
  ulong uVar1;
  EnumVal *ev;
  pointer ppEVar2;
  string *code;
  ulong max_name_length;
  
  if ((enum_def->super_Definition).generated != false) {
    return;
  }
  max_name_length = 0;
  for (ppEVar2 = (enum_def->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar2 !=
      (enum_def->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
    uVar1 = ((*ppEVar2)->name)._M_string_length;
    if (max_name_length < uVar1) {
      max_name_length = uVar1;
    }
  }
  this->cur_name_space_ = (enum_def->super_Definition).defined_namespace;
  GenComment(&(enum_def->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
  GenEnumType(this,enum_def,code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  for (ppEVar2 = (enum_def->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar2 !=
      (enum_def->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
    ev = *ppEVar2;
    GenComment(&ev->doc_comment,code_ptr,(CommentConfig *)0x0,"\t");
    EnumMember(this,enum_def,ev,max_name_length,code_ptr);
  }
  std::__cxx11::string::append((char *)code_ptr);
  BeginEnumNames(this,enum_def,code_ptr);
  for (ppEVar2 = (enum_def->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar2 !=
      (enum_def->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
    EnumNameMember(this,enum_def,*ppEVar2,max_name_length,code_ptr);
  }
  std::__cxx11::string::append((char *)code_ptr);
  BeginEnumValues(this,enum_def,code_ptr);
  for (ppEVar2 = (enum_def->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar2 !=
      (enum_def->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
    EnumValueMember(this,enum_def,*ppEVar2,max_name_length,code_ptr);
  }
  std::__cxx11::string::append((char *)code_ptr);
  EnumStringer(this,enum_def,code_ptr);
  return;
}

Assistant:

void GenEnum(const EnumDef &enum_def, std::string *code_ptr) {
    if (enum_def.generated) return;

    auto max_name_length = MaxNameLength(enum_def);
    cur_name_space_ = enum_def.defined_namespace;

    GenComment(enum_def.doc_comment, code_ptr, nullptr);
    GenEnumType(enum_def, code_ptr);
    BeginEnum(code_ptr);
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      const EnumVal &ev = **it;
      GenComment(ev.doc_comment, code_ptr, nullptr, "\t");
      EnumMember(enum_def, ev, max_name_length, code_ptr);
    }
    EndEnum(code_ptr);

    BeginEnumNames(enum_def, code_ptr);
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      const EnumVal &ev = **it;
      EnumNameMember(enum_def, ev, max_name_length, code_ptr);
    }
    EndEnumNames(code_ptr);

    BeginEnumValues(enum_def, code_ptr);
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      EnumValueMember(enum_def, ev, max_name_length, code_ptr);
    }
    EndEnumValues(code_ptr);

    EnumStringer(enum_def, code_ptr);
  }